

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O2

void __thiscall
optimization::loop_expand::Const_Loop_Expand::optimize_mir
          (Const_Loop_Expand *this,MirPackage *mir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *__lhs;
  
  for (p_Var2 = (mir->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(mir->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(char *)&p_Var2[3]._M_parent[1]._M_left == '\0') {
      __lhs = p_Var2 + 1;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"$$5_main");
      if (!bVar1) {
        optimize_func((Const_Loop_Expand *)__lhs,(MirFunction *)(p_Var2 + 2));
      }
    }
  }
  return;
}

Assistant:

void Const_Loop_Expand::optimize_mir(
    mir::inst::MirPackage& mir,
    std::map<std::string, std::any>& extra_data_repo) {
  for (auto& f : mir.functions) {
    if (f.second.type->is_extern || f.first == "$$5_main") continue;
    optimize_func(f.second);
  }
}